

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

ON_NurbsCage * __thiscall ON_NurbsCage::operator=(ON_NurbsCage *this,ON_NurbsCage *src)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  double *pdVar7;
  
  if (this != src) {
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
    bVar1 = Create(this,src->m_dim,src->m_is_rat,src->m_order[0],src->m_order[1],src->m_order[2],
                   src->m_cv_count[0],src->m_cv_count[1],src->m_cv_count[2]);
    if (bVar1) {
      iVar2 = this->m_order[0];
      if (((iVar2 <= this->m_cv_count[0] && 1 < iVar2) &&
          (pdVar7 = this->m_knot[0], pdVar7 != (double *)0x0)) &&
         (pdVar6 = src->m_knot[0], pdVar6 != (double *)0x0)) {
        iVar2 = ON_KnotCount(iVar2,this->m_cv_count[0]);
        memcpy(pdVar7,pdVar6,(long)iVar2 << 3);
      }
      if (((1 < this->m_order[1]) && (this->m_order[1] <= this->m_cv_count[1])) &&
         ((pdVar7 = this->m_knot[1], pdVar7 != (double *)0x0 &&
          (pdVar6 = src->m_knot[1], pdVar6 != (double *)0x0)))) {
        iVar2 = ON_KnotCount(this->m_order[1],this->m_cv_count[1]);
        memcpy(pdVar7,pdVar6,(long)iVar2 << 3);
      }
      if (((1 < this->m_order[2]) && (this->m_order[2] <= this->m_cv_count[2])) &&
         ((pdVar7 = this->m_knot[2], pdVar7 != (double *)0x0 &&
          (pdVar6 = src->m_knot[2], pdVar6 != (double *)0x0)))) {
        iVar2 = ON_KnotCount(this->m_order[2],this->m_cv_count[2]);
        memcpy(pdVar7,pdVar6,(long)iVar2 << 3);
      }
      pdVar7 = this->m_cv;
      if ((((pdVar7 != (double *)0x0) && (src->m_cv != (double *)0x0)) && (0 < this->m_cv_stride[0])
          ) && ((0 < this->m_cv_stride[1] && (0 < this->m_cv_stride[2])))) {
        if ((this->m_is_rat == true) && (0 < this->m_dim)) {
          iVar2 = this->m_dim + 1;
        }
        else {
          iVar2 = this->m_dim;
        }
        if (((this->m_cv_stride[0] == src->m_cv_stride[0]) &&
            (this->m_cv_stride[1] == src->m_cv_stride[1])) &&
           (this->m_cv_stride[2] == src->m_cv_stride[2])) {
          memcpy(pdVar7,src->m_cv,
                 (long)(this->m_cv_count[0] * iVar2 * 8 * this->m_cv_count[1] * this->m_cv_count[2])
                );
        }
        else if (0 < this->m_cv_count[0]) {
          iVar3 = 0;
          do {
            if (0 < this->m_cv_count[1]) {
              iVar4 = 0;
              do {
                if (0 < this->m_cv_count[2]) {
                  iVar5 = 0;
                  do {
                    if (src->m_cv == (double *)0x0) {
                      pdVar6 = (double *)0x0;
                    }
                    else {
                      pdVar6 = src->m_cv +
                               (long)src->m_cv_stride[0] * (long)iVar3 +
                               (long)src->m_cv_stride[1] * (long)iVar4 +
                               (long)iVar5 * (long)src->m_cv_stride[2];
                    }
                    memcpy(pdVar7,pdVar6,(long)(iVar2 * 8));
                    iVar5 = iVar5 + 1;
                    pdVar7 = pdVar7 + iVar2;
                  } while (iVar5 < this->m_cv_count[2]);
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < this->m_cv_count[1]);
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 < this->m_cv_count[0]);
        }
      }
    }
    else {
      Destroy(this);
    }
  }
  return this;
}

Assistant:

ON_NurbsCage& ON_NurbsCage::operator=(const ON_NurbsCage& src)
{
  if ( this != &src ) 
  {
    ON_Geometry::operator=(src);
    if ( Create( src.m_dim, src.m_is_rat, 
         src.m_order[0], src.m_order[1], src.m_order[2],
         src.m_cv_count[0], src.m_cv_count[1], src.m_cv_count[2]
         ) )
    {
      if ( m_order[0] >= 2 && m_cv_count[0] >= m_order[0] && m_knot[0] && src.m_knot[0] )
        memcpy( m_knot[0], src.m_knot[0], KnotCount(0)*sizeof(m_knot[0][0]));
      if ( m_order[1] >= 2 && m_cv_count[1] >= m_order[1] && m_knot[1] && src.m_knot[1]  )
        memcpy( m_knot[1], src.m_knot[1], KnotCount(1)*sizeof(m_knot[1][0]));
      if ( m_order[2] >= 2 && m_cv_count[2] >= m_order[2] && m_knot[2] && src.m_knot[2]  )
        memcpy( m_knot[2], src.m_knot[2], KnotCount(2)*sizeof(m_knot[2][0]));

      if ( m_cv && src.m_cv && m_cv_stride[0] > 0 && m_cv_stride[1] > 0 && m_cv_stride[2] > 0 )
      {
        const int cv_dim = CVSize();
        const int sizeofcv = cv_dim*sizeof(m_cv[0]);
        if (    m_cv_stride[0] == src.m_cv_stride[0] 
            && m_cv_stride[1] == src.m_cv_stride[1]
            && m_cv_stride[2] == src.m_cv_stride[2] )
        {
          memcpy(m_cv,src.m_cv,m_cv_count[0]*m_cv_count[1]*m_cv_count[2]*sizeofcv);
        }
        else
        {
          int i, j, k;
          double* cv = m_cv;
          for ( i = 0; i < m_cv_count[0]; i++ ) 
          for ( j = 0; j < m_cv_count[1]; j++ ) 
          for ( k = 0; k < m_cv_count[2]; k++ ) 
          {
            memcpy( cv, src.CV(i,j,k), sizeofcv );
            cv += cv_dim;
          }
        }
      }
    }
    else 
    {
      Destroy();
    }
  }
  return *this;
}